

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall
duckdb::Vector::Vector
          (Vector *this,LogicalType *type_p,bool create_data,bool initialize_to_zero,idx_t capacity)

{
  byte in_DL;
  undefined1 *in_RDI;
  bool in_stack_0000005f;
  Vector *in_stack_00000060;
  LogicalType *in_stack_ffffffffffffffa8;
  LogicalType *in_stack_ffffffffffffffb0;
  
  *in_RDI = 0;
  LogicalType::LogicalType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  ValidityMask::ValidityMask
            ((ValidityMask *)in_stack_ffffffffffffffb0,(idx_t)in_stack_ffffffffffffffa8);
  shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr
            ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3db754);
  shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr
            ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3db768);
  if ((in_DL & 1) != 0) {
    Initialize(in_stack_00000060,in_stack_0000005f,(idx_t)this);
  }
  return;
}

Assistant:

Vector::Vector(LogicalType type_p, bool create_data, bool initialize_to_zero, idx_t capacity)
    : vector_type(VectorType::FLAT_VECTOR), type(std::move(type_p)), data(nullptr), validity(capacity) {
	if (create_data) {
		Initialize(initialize_to_zero, capacity);
	}
}